

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O1

string * __thiscall
CLIntercept::getShortKernelNameWithHash_abi_cxx11_
          (string *__return_storage_ptr__,CLIntercept *this,cl_kernel kernel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  pointer pcVar5;
  mapped_type *__k;
  iterator iVar6;
  mapped_type *pmVar7;
  char *__format;
  char hashString [256];
  cl_kernel local_130;
  cl_kernel local_128 [33];
  
  local_130 = kernel;
  local_128[0] = kernel;
  __k = std::
        map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
        ::operator[](&this->m_KernelInfoMap,local_128);
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_LongKernelNameMap)._M_h,&__k->KernelName);
  pmVar7 = (mapped_type *)
           ((long)iVar6.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur + 0x28);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pmVar7 = __k;
  }
  sVar4 = (pmVar7->KernelName)._M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = (pmVar7->KernelName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar5,pcVar5 + sVar4);
  if ((this->m_Config).KernelNameHashTracking == true) {
    pmVar7 = std::
             map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             ::operator[](&this->m_KernelInfoMap,&local_130);
    memset(local_128,0,0x100);
    if ((this->m_Config).OmitProgramNumber == true) {
      uVar1 = pmVar7->CompileCount;
      uVar2 = (uint)pmVar7->ProgramHash;
      uVar3 = (uint)pmVar7->OptionsHash;
      __format = "$%08X_%04u_%08X";
    }
    else {
      uVar2 = pmVar7->ProgramNumber;
      uVar3 = pmVar7->CompileCount;
      uVar1 = (uint)pmVar7->ProgramHash;
      __format = "$%04u_%08X_%04u_%08X";
    }
    snprintf((char *)local_128,0x100,__format,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string CLIntercept::getShortKernelNameWithHash(
    const cl_kernel kernel )
{
    std::string name = getShortKernelName( kernel );

    if( config().KernelNameHashTracking )
    {
        const SKernelInfo& kernelInfo = m_KernelInfoMap[ kernel ];

        char    hashString[256] = "";
        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( hashString, 256, "$%08X_%04u_%08X",
                (unsigned int)kernelInfo.ProgramHash,
                kernelInfo.CompileCount,
                (unsigned int)kernelInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( hashString, 256, "$%04u_%08X_%04u_%08X",
                kernelInfo.ProgramNumber,
                (unsigned int)kernelInfo.ProgramHash,
                kernelInfo.CompileCount,
                (unsigned int)kernelInfo.OptionsHash );
        }

        name += hashString;
    }

    return name;
}